

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
minja::Value::get<std::__cxx11::string>
          (Value *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value)

{
  bool bVar1;
  string *in_RCX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Value *in_stack_ffffffffffffff48;
  Value *this_00;
  Value *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb8;
  
  bVar1 = contains((Value *)in_stack_ffffffffffffffb8._M_pi,in_stack_ffffffffffffffb0);
  if (bVar1) {
    this_00 = (Value *)&stack0xffffffffffffff90;
    Value(in_stack_ffffffffffffff80,in_RSI);
    at(this_00,in_stack_ffffffffffffff48);
    get<std::__cxx11::string>((Value *)in_stack_ffffffffffffffb8._M_pi);
    ~Value(this_00);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,in_RCX);
  }
  return in_RDI;
}

Assistant:

T get(const std::string & key, T default_value) const {
    if (!contains(key)) return default_value;
    return at(key).get<T>();
  }